

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_addrinuse_listen(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  code *unaff_RBX;
  long *plVar3;
  uv_handle_t *handle;
  int64_t eval_b_1;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_tcp_t server2;
  uv_tcp_t server1;
  undefined1 auStack_c80 [16];
  undefined8 uStack_c70;
  uv_tcp_t uStack_c60;
  uv_loop_t *puStack_b88;
  long lStack_b78;
  long lStack_b70;
  uv_shutdown_t uStack_b68;
  sockaddr_in sStack_b10;
  uv_write_t uStack_b00;
  uv_buf_t uStack_a38;
  uv_tcp_t uStack_a28;
  uv_loop_t *puStack_950;
  long lStack_940;
  long lStack_938;
  uv_tcp_t uStack_930;
  uv_loop_t *puStack_858;
  long lStack_848;
  long lStack_840;
  sockaddr_in sStack_838;
  uv_tcp_t uStack_828;
  uv_loop_t *puStack_750;
  long lStack_740;
  long lStack_738;
  sockaddr_in sStack_730;
  uv_tcp_t uStack_720;
  uv_loop_t *puStack_648;
  long lStack_638;
  long lStack_630;
  sockaddr_in sStack_628;
  sockaddr_in sStack_618;
  uv_tcp_t uStack_608;
  uv_loop_t *puStack_530;
  long lStack_528;
  long lStack_520;
  sockaddr sStack_518;
  char acStack_508 [56];
  uv_tcp_t uStack_4d0;
  uv_loop_t *puStack_3f8;
  long lStack_3e8;
  long lStack_3e0;
  sockaddr_in sStack_3d8;
  uv_tcp_t uStack_3c8;
  uv_loop_t *puStack_2f0;
  long lStack_2e0;
  long lStack_2d8;
  sockaddr_in sStack_2d0;
  uv_tcp_t uStack_2c0;
  uv_loop_t *puStack_1e8;
  code *pcStack_1e0;
  long local_1d8;
  long local_1d0;
  sockaddr_in local_1c8;
  uv_tcp_t local_1b8;
  uv_tcp_t local_e0;
  
  plVar3 = &local_1d8;
  pcStack_1e0 = (code *)0x1c2750;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_1c8);
  local_e0.data = (void *)(long)iVar1;
  local_1b8.data = (void *)0x0;
  if (local_e0.data == (void *)0x0) {
    pcStack_1e0 = (code *)0x1c277b;
    puVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c278b;
    iVar1 = uv_tcp_init(puVar2,&local_e0);
    local_1b8.data = (void *)(long)iVar1;
    local_1d8 = 0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c295d;
    pcStack_1e0 = (code *)0x1c27bd;
    iVar1 = uv_tcp_bind(&local_e0,(sockaddr *)&local_1c8,0);
    local_1b8.data = (void *)(long)iVar1;
    local_1d8 = 0;
    if (local_1b8.data != (void *)0x0) goto LAB_001c296a;
    pcStack_1e0 = (code *)0x1c27e0;
    puVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c27ed;
    iVar1 = uv_tcp_init(puVar2,&local_1b8);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c2977;
    pcStack_1e0 = (code *)0x1c281c;
    iVar1 = uv_tcp_bind(&local_1b8,(sockaddr *)&local_1c8,0);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c2984;
    pcStack_1e0 = (code *)0x1c284e;
    iVar1 = uv_listen((uv_stream_t *)&local_e0,0x80,(uv_connection_cb)0x0);
    local_1d8 = (long)iVar1;
    local_1d0 = 0;
    if (local_1d8 != 0) goto LAB_001c2991;
    pcStack_1e0 = (code *)0x1c287d;
    iVar1 = uv_listen((uv_stream_t *)&local_1b8,0x80,(uv_connection_cb)0x0);
    local_1d8 = (long)iVar1;
    local_1d0 = -0x62;
    if (local_1d8 != -0x62) goto LAB_001c299e;
    unaff_RBX = close_cb;
    pcStack_1e0 = (code *)0x1c28b2;
    uv_close((uv_handle_t *)&local_e0,close_cb);
    pcStack_1e0 = (code *)0x1c28bf;
    uv_close((uv_handle_t *)&local_1b8,close_cb);
    pcStack_1e0 = (code *)0x1c28c4;
    puVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c28ce;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_1d8 = 2;
    local_1d0 = (long)close_cb_called;
    if (local_1d0 != 2) goto LAB_001c29ab;
    pcStack_1e0 = (code *)0x1c28f6;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_1e0 = (code *)0x1c290a;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_1e0 = (code *)0x1c2914;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_1d8 = 0;
    pcStack_1e0 = (code *)0x1c2921;
    puVar2 = uv_default_loop();
    pcStack_1e0 = (code *)0x1c2929;
    iVar1 = uv_loop_close(puVar2);
    local_1d0 = (long)iVar1;
    if (local_1d8 == local_1d0) {
      pcStack_1e0 = (code *)0x1c2940;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1e0 = (code *)0x1c295d;
    run_test_tcp_bind_error_addrinuse_listen_cold_1();
LAB_001c295d:
    pcStack_1e0 = (code *)0x1c296a;
    run_test_tcp_bind_error_addrinuse_listen_cold_2();
LAB_001c296a:
    pcStack_1e0 = (code *)0x1c2977;
    run_test_tcp_bind_error_addrinuse_listen_cold_3();
LAB_001c2977:
    pcStack_1e0 = (code *)0x1c2984;
    run_test_tcp_bind_error_addrinuse_listen_cold_4();
LAB_001c2984:
    pcStack_1e0 = (code *)0x1c2991;
    run_test_tcp_bind_error_addrinuse_listen_cold_5();
LAB_001c2991:
    pcStack_1e0 = (code *)0x1c299e;
    run_test_tcp_bind_error_addrinuse_listen_cold_6();
LAB_001c299e:
    pcStack_1e0 = (code *)0x1c29ab;
    run_test_tcp_bind_error_addrinuse_listen_cold_7();
LAB_001c29ab:
    pcStack_1e0 = (code *)0x1c29b8;
    run_test_tcp_bind_error_addrinuse_listen_cold_8();
  }
  pcStack_1e0 = close_cb;
  run_test_tcp_bind_error_addrinuse_listen_cold_9();
  if (plVar3 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  puStack_1e8 = (uv_loop_t *)run_test_tcp_bind_error_addrnotavail_1;
  close_cb_cold_1();
  puStack_2f0 = (uv_loop_t *)0x1c29f5;
  puStack_1e8 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,&sStack_2d0);
  uStack_2c0.data = (void *)(long)iVar1;
  lStack_2e0 = 0;
  if (uStack_2c0.data == (void *)0x0) {
    puStack_2f0 = (uv_loop_t *)0x1c2a1a;
    puVar2 = uv_default_loop();
    puStack_2f0 = (uv_loop_t *)0x1c2a27;
    iVar1 = uv_tcp_init(puVar2,&uStack_2c0);
    lStack_2e0 = (long)iVar1;
    lStack_2d8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c2b11;
    puStack_2f0 = (uv_loop_t *)0x1c2a58;
    iVar1 = uv_tcp_bind(&uStack_2c0,(sockaddr *)&sStack_2d0,0);
    if ((iVar1 == -99) || (iVar1 == 0)) {
      puStack_2f0 = (uv_loop_t *)0x1c2a76;
      uv_close((uv_handle_t *)&uStack_2c0,close_cb);
      puStack_2f0 = (uv_loop_t *)0x1c2a7b;
      puVar2 = uv_default_loop();
      puStack_2f0 = (uv_loop_t *)0x1c2a85;
      uv_run(puVar2,UV_RUN_DEFAULT);
      lStack_2e0 = 1;
      lStack_2d8 = (long)close_cb_called;
      if (lStack_2d8 != 1) goto LAB_001c2b20;
      puStack_2f0 = (uv_loop_t *)0x1c2aab;
      unaff_RBX = (code *)uv_default_loop();
      puStack_2f0 = (uv_loop_t *)0x1c2abf;
      uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_2f0 = (uv_loop_t *)0x1c2ac9;
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
      lStack_2e0 = 0;
      puStack_2f0 = (uv_loop_t *)0x1c2ad7;
      puVar2 = uv_default_loop();
      puStack_2f0 = (uv_loop_t *)0x1c2adf;
      iVar1 = uv_loop_close(puVar2);
      lStack_2d8 = (long)iVar1;
      if (lStack_2e0 == lStack_2d8) {
        puStack_2f0 = (uv_loop_t *)0x1c2af7;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c2b2f;
    }
  }
  else {
    puStack_2f0 = (uv_loop_t *)0x1c2b11;
    run_test_tcp_bind_error_addrnotavail_1_cold_1();
LAB_001c2b11:
    puStack_2f0 = (uv_loop_t *)0x1c2b20;
    run_test_tcp_bind_error_addrnotavail_1_cold_2();
LAB_001c2b20:
    puStack_2f0 = (uv_loop_t *)0x1c2b2f;
    run_test_tcp_bind_error_addrnotavail_1_cold_3();
LAB_001c2b2f:
    puStack_2f0 = (uv_loop_t *)0x1c2b3e;
    run_test_tcp_bind_error_addrnotavail_1_cold_4();
  }
  puStack_2f0 = (uv_loop_t *)run_test_tcp_bind_error_addrnotavail_2;
  run_test_tcp_bind_error_addrnotavail_1_cold_5();
  puStack_3f8 = (uv_loop_t *)0x1c2b61;
  puStack_2f0 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,&sStack_3d8);
  uStack_3c8.data = (void *)(long)iVar1;
  lStack_3e8 = 0;
  if (uStack_3c8.data == (void *)0x0) {
    puStack_3f8 = (uv_loop_t *)0x1c2b86;
    puVar2 = uv_default_loop();
    puStack_3f8 = (uv_loop_t *)0x1c2b93;
    iVar1 = uv_tcp_init(puVar2,&uStack_3c8);
    lStack_3e8 = (long)iVar1;
    lStack_3e0 = 0;
    if (lStack_3e8 != 0) goto LAB_001c2c94;
    puStack_3f8 = (uv_loop_t *)0x1c2bc4;
    iVar1 = uv_tcp_bind(&uStack_3c8,(sockaddr *)&sStack_3d8,0);
    lStack_3e8 = (long)iVar1;
    lStack_3e0 = -99;
    if (lStack_3e8 != -99) goto LAB_001c2ca3;
    puStack_3f8 = (uv_loop_t *)0x1c2bf5;
    uv_close((uv_handle_t *)&uStack_3c8,close_cb);
    puStack_3f8 = (uv_loop_t *)0x1c2bfa;
    puVar2 = uv_default_loop();
    puStack_3f8 = (uv_loop_t *)0x1c2c04;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_3e8 = 1;
    lStack_3e0 = (long)close_cb_called;
    if (lStack_3e0 != 1) goto LAB_001c2cb2;
    puStack_3f8 = (uv_loop_t *)0x1c2c2e;
    unaff_RBX = (code *)uv_default_loop();
    puStack_3f8 = (uv_loop_t *)0x1c2c42;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_3f8 = (uv_loop_t *)0x1c2c4c;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_3e8 = 0;
    puStack_3f8 = (uv_loop_t *)0x1c2c5a;
    puVar2 = uv_default_loop();
    puStack_3f8 = (uv_loop_t *)0x1c2c62;
    iVar1 = uv_loop_close(puVar2);
    lStack_3e0 = (long)iVar1;
    if (lStack_3e8 == lStack_3e0) {
      puStack_3f8 = (uv_loop_t *)0x1c2c7a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_3f8 = (uv_loop_t *)0x1c2c94;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_001c2c94:
    puStack_3f8 = (uv_loop_t *)0x1c2ca3;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_001c2ca3:
    puStack_3f8 = (uv_loop_t *)0x1c2cb2;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_001c2cb2:
    puStack_3f8 = (uv_loop_t *)0x1c2cc1;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  puStack_3f8 = (uv_loop_t *)run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_508 + 0x20,"h blah blah",0xc);
  builtin_strncpy(acStack_508 + 0x10,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_508,"lah blah blah bl",0x10);
  sStack_518._0_8_ = 0x616c622068616c62;
  builtin_strncpy(sStack_518.sa_data + 6,"h blah b",8);
  puStack_530 = (uv_loop_t *)0x1c2d0d;
  puStack_3f8 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_530 = (uv_loop_t *)0x1c2d1a;
  iVar1 = uv_tcp_init(puVar2,&uStack_4d0);
  lStack_520 = (long)iVar1;
  lStack_528 = 0;
  if (lStack_520 == 0) {
    puStack_530 = (uv_loop_t *)0x1c2d49;
    iVar1 = uv_tcp_bind(&uStack_4d0,&sStack_518,0);
    lStack_520 = (long)iVar1;
    lStack_528 = -0x16;
    if (lStack_520 != -0x16) goto LAB_001c2e0d;
    puStack_530 = (uv_loop_t *)0x1c2d78;
    uv_close((uv_handle_t *)&uStack_4d0,close_cb);
    puStack_530 = (uv_loop_t *)0x1c2d7d;
    puVar2 = uv_default_loop();
    puStack_530 = (uv_loop_t *)0x1c2d87;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_520 = 1;
    lStack_528 = (long)close_cb_called;
    if (lStack_528 != 1) goto LAB_001c2e1a;
    puStack_530 = (uv_loop_t *)0x1c2dab;
    unaff_RBX = (code *)uv_default_loop();
    puStack_530 = (uv_loop_t *)0x1c2dbf;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_530 = (uv_loop_t *)0x1c2dc9;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_520 = 0;
    puStack_530 = (uv_loop_t *)0x1c2dd7;
    puVar2 = uv_default_loop();
    puStack_530 = (uv_loop_t *)0x1c2ddf;
    iVar1 = uv_loop_close(puVar2);
    lStack_528 = (long)iVar1;
    if (lStack_520 == lStack_528) {
      puStack_530 = (uv_loop_t *)0x1c2df5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_530 = (uv_loop_t *)0x1c2e0d;
    run_test_tcp_bind_error_fault_cold_1();
LAB_001c2e0d:
    puStack_530 = (uv_loop_t *)0x1c2e1a;
    run_test_tcp_bind_error_fault_cold_2();
LAB_001c2e1a:
    puStack_530 = (uv_loop_t *)0x1c2e27;
    run_test_tcp_bind_error_fault_cold_3();
  }
  puStack_530 = (uv_loop_t *)run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  puStack_648 = (uv_loop_t *)0x1c2e52;
  puStack_530 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_618);
  uStack_608.data = (void *)(long)iVar1;
  sStack_628.sin_family = 0;
  sStack_628.sin_port = 0;
  sStack_628.sin_addr.s_addr = 0;
  if (uStack_608.data == (void *)0x0) {
    puStack_648 = (uv_loop_t *)0x1c2e88;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&sStack_628);
    uStack_608.data = (void *)(long)iVar1;
    lStack_638 = 0;
    if (uStack_608.data != (void *)0x0) goto LAB_001c2fec;
    puStack_648 = (uv_loop_t *)0x1c2ead;
    puVar2 = uv_default_loop();
    puStack_648 = (uv_loop_t *)0x1c2eba;
    iVar1 = uv_tcp_init(puVar2,&uStack_608);
    lStack_638 = (long)iVar1;
    lStack_630 = 0;
    if (lStack_638 != 0) goto LAB_001c2ffb;
    puStack_648 = (uv_loop_t *)0x1c2eeb;
    iVar1 = uv_tcp_bind(&uStack_608,(sockaddr *)&sStack_618,0);
    lStack_638 = (long)iVar1;
    lStack_630 = 0;
    if (lStack_638 != 0) goto LAB_001c300a;
    puStack_648 = (uv_loop_t *)0x1c2f1c;
    iVar1 = uv_tcp_bind(&uStack_608,(sockaddr *)&sStack_628,0);
    lStack_638 = (long)iVar1;
    lStack_630 = -0x16;
    if (lStack_638 != -0x16) goto LAB_001c3019;
    puStack_648 = (uv_loop_t *)0x1c2f4d;
    uv_close((uv_handle_t *)&uStack_608,close_cb);
    puStack_648 = (uv_loop_t *)0x1c2f52;
    puVar2 = uv_default_loop();
    puStack_648 = (uv_loop_t *)0x1c2f5c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_638 = 1;
    lStack_630 = (long)close_cb_called;
    if (lStack_630 != 1) goto LAB_001c3028;
    puStack_648 = (uv_loop_t *)0x1c2f86;
    unaff_RBX = (code *)uv_default_loop();
    puStack_648 = (uv_loop_t *)0x1c2f9a;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_648 = (uv_loop_t *)0x1c2fa4;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_638 = 0;
    puStack_648 = (uv_loop_t *)0x1c2fb2;
    puVar2 = uv_default_loop();
    puStack_648 = (uv_loop_t *)0x1c2fba;
    iVar1 = uv_loop_close(puVar2);
    lStack_630 = (long)iVar1;
    if (lStack_638 == lStack_630) {
      puStack_648 = (uv_loop_t *)0x1c2fd2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_648 = (uv_loop_t *)0x1c2fec;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c2fec:
    puStack_648 = (uv_loop_t *)0x1c2ffb;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c2ffb:
    puStack_648 = (uv_loop_t *)0x1c300a;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c300a:
    puStack_648 = (uv_loop_t *)0x1c3019;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c3019:
    puStack_648 = (uv_loop_t *)0x1c3028;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c3028:
    puStack_648 = (uv_loop_t *)0x1c3037;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_648 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_750 = (uv_loop_t *)0x1c3064;
  puStack_648 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_730);
  uStack_720.data = (void *)(long)iVar1;
  lStack_740 = 0;
  if (uStack_720.data == (void *)0x0) {
    puStack_750 = (uv_loop_t *)0x1c3089;
    puVar2 = uv_default_loop();
    puStack_750 = (uv_loop_t *)0x1c3096;
    iVar1 = uv_tcp_init(puVar2,&uStack_720);
    lStack_740 = (long)iVar1;
    lStack_738 = 0;
    if (lStack_740 != 0) goto LAB_001c314e;
    puStack_750 = (uv_loop_t *)0x1c30c7;
    iVar1 = uv_tcp_bind(&uStack_720,(sockaddr *)&sStack_730,0);
    lStack_740 = (long)iVar1;
    lStack_738 = 0;
    if (lStack_740 != 0) goto LAB_001c315d;
    puStack_750 = (uv_loop_t *)0x1c30e8;
    unaff_RBX = (code *)uv_default_loop();
    puStack_750 = (uv_loop_t *)0x1c30fc;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_750 = (uv_loop_t *)0x1c3106;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_740 = 0;
    puStack_750 = (uv_loop_t *)0x1c3114;
    puVar2 = uv_default_loop();
    puStack_750 = (uv_loop_t *)0x1c311c;
    iVar1 = uv_loop_close(puVar2);
    lStack_738 = (long)iVar1;
    if (lStack_740 == lStack_738) {
      puStack_750 = (uv_loop_t *)0x1c3134;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_750 = (uv_loop_t *)0x1c314e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c314e:
    puStack_750 = (uv_loop_t *)0x1c315d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c315d:
    puStack_750 = (uv_loop_t *)0x1c316c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_750 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_858 = (uv_loop_t *)0x1c3199;
  puStack_750 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_838);
  uStack_828.data = (void *)(long)iVar1;
  lStack_848 = 0;
  if (uStack_828.data == (void *)0x0) {
    puStack_858 = (uv_loop_t *)0x1c31be;
    puVar2 = uv_default_loop();
    puStack_858 = (uv_loop_t *)0x1c31cb;
    iVar1 = uv_tcp_init(puVar2,&uStack_828);
    lStack_848 = (long)iVar1;
    lStack_840 = 0;
    if (lStack_848 != 0) goto LAB_001c3286;
    puStack_858 = (uv_loop_t *)0x1c31ff;
    iVar1 = uv_tcp_bind(&uStack_828,(sockaddr *)&sStack_838,1);
    lStack_848 = (long)iVar1;
    lStack_840 = -0x16;
    if (lStack_848 != -0x16) goto LAB_001c3295;
    puStack_858 = (uv_loop_t *)0x1c3220;
    unaff_RBX = (code *)uv_default_loop();
    puStack_858 = (uv_loop_t *)0x1c3234;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_858 = (uv_loop_t *)0x1c323e;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_848 = 0;
    puStack_858 = (uv_loop_t *)0x1c324c;
    puVar2 = uv_default_loop();
    puStack_858 = (uv_loop_t *)0x1c3254;
    iVar1 = uv_loop_close(puVar2);
    lStack_840 = (long)iVar1;
    if (lStack_848 == lStack_840) {
      puStack_858 = (uv_loop_t *)0x1c326c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_858 = (uv_loop_t *)0x1c3286;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c3286:
    puStack_858 = (uv_loop_t *)0x1c3295;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c3295:
    puStack_858 = (uv_loop_t *)0x1c32a4;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_858 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  puStack_950 = (uv_loop_t *)0x1c32c0;
  puStack_858 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_950 = (uv_loop_t *)0x1c32cd;
  iVar1 = uv_tcp_init(puVar2,&uStack_930);
  lStack_938 = (long)iVar1;
  lStack_940 = 0;
  if (lStack_938 == 0) {
    puStack_950 = (uv_loop_t *)0x1c32fe;
    iVar1 = uv_listen((uv_stream_t *)&uStack_930,0x80,(uv_connection_cb)0x0);
    lStack_938 = (long)iVar1;
    lStack_940 = 0;
    if (lStack_938 != 0) goto LAB_001c3385;
    puStack_950 = (uv_loop_t *)0x1c331f;
    unaff_RBX = (code *)uv_default_loop();
    puStack_950 = (uv_loop_t *)0x1c3333;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_950 = (uv_loop_t *)0x1c333d;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_938 = 0;
    puStack_950 = (uv_loop_t *)0x1c334b;
    puVar2 = uv_default_loop();
    puStack_950 = (uv_loop_t *)0x1c3353;
    iVar1 = uv_loop_close(puVar2);
    lStack_940 = (long)iVar1;
    if (lStack_938 == lStack_940) {
      puStack_950 = (uv_loop_t *)0x1c336b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_950 = (uv_loop_t *)0x1c3385;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c3385:
    puStack_950 = (uv_loop_t *)0x1c3394;
    run_test_tcp_listen_without_bind_cold_2();
  }
  puStack_950 = (uv_loop_t *)run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  puStack_b88 = (uv_loop_t *)0x1c33c1;
  puStack_950 = (uv_loop_t *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_b10);
  uStack_a28.data = (void *)(long)iVar1;
  uStack_b00.data = (void *)0x0;
  if (uStack_a28.data == (void *)0x0) {
    puStack_b88 = (uv_loop_t *)0x1c33f2;
    puVar2 = uv_default_loop();
    puStack_b88 = (uv_loop_t *)0x1c3402;
    iVar1 = uv_tcp_init(puVar2,&uStack_a28);
    uStack_b00.data = (void *)(long)iVar1;
    uStack_b68.data = (void *)0x0;
    if (uStack_b00.data != (void *)0x0) goto LAB_001c368a;
    puStack_b88 = (uv_loop_t *)0x1c343c;
    iVar1 = uv_tcp_bind(&uStack_a28,(sockaddr *)&sStack_b10,0);
    uStack_b00.data = (void *)(long)iVar1;
    uStack_b68.data = (void *)0x0;
    if (uStack_b00.data != (void *)0x0) goto LAB_001c369c;
    puStack_b88 = (uv_loop_t *)0x1c3476;
    iVar1 = uv_listen((uv_stream_t *)&uStack_a28,0x80,(uv_connection_cb)0x0);
    uStack_b00.data = (void *)(long)iVar1;
    uStack_b68.data = (void *)0x0;
    if (uStack_b00.data != (void *)0x0) goto LAB_001c36ae;
    puStack_b88 = (uv_loop_t *)0x1c34a9;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_a28);
    uStack_b00.data = (void *)(long)iVar1;
    uStack_b68.data = (void *)0x0;
    if (uStack_b00.data != (void *)0x0) goto LAB_001c36c0;
    puStack_b88 = (uv_loop_t *)0x1c34dc;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_a28);
    uStack_b00.data = (void *)(long)iVar1;
    uStack_b68.data = (void *)0x0;
    if (uStack_b00.data != (void *)0x0) goto LAB_001c36d2;
    puStack_b88 = (uv_loop_t *)0x1c3513;
    uStack_a38 = uv_buf_init("PING",4);
    puStack_b88 = (uv_loop_t *)0x1c3542;
    iVar1 = uv_write(&uStack_b00,(uv_stream_t *)&uStack_a28,&uStack_a38,1,(uv_write_cb)0x0);
    uStack_b68.data = (void *)(long)iVar1;
    lStack_b78 = -0x20;
    if (uStack_b68.data != (void *)0xffffffffffffffe0) goto LAB_001c36e4;
    puStack_b88 = (uv_loop_t *)0x1c3576;
    iVar1 = uv_shutdown(&uStack_b68,(uv_stream_t *)&uStack_a28,(uv_shutdown_cb)0x0);
    lStack_b78 = (long)iVar1;
    lStack_b70 = -0x6b;
    if (lStack_b78 != -0x6b) goto LAB_001c36f3;
    puStack_b88 = (uv_loop_t *)0x1c35ad;
    iVar1 = uv_read_start((uv_stream_t *)&uStack_a28,abort,abort);
    lStack_b78 = (long)iVar1;
    lStack_b70 = -0x6b;
    if (lStack_b78 != -0x6b) goto LAB_001c3702;
    puStack_b88 = (uv_loop_t *)0x1c35e1;
    uv_close((uv_handle_t *)&uStack_a28,close_cb);
    puStack_b88 = (uv_loop_t *)0x1c35e6;
    puVar2 = uv_default_loop();
    puStack_b88 = (uv_loop_t *)0x1c35f0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_b78 = 1;
    lStack_b70 = (long)close_cb_called;
    if (lStack_b70 != 1) goto LAB_001c3711;
    puStack_b88 = (uv_loop_t *)0x1c361a;
    unaff_RBX = (code *)uv_default_loop();
    puStack_b88 = (uv_loop_t *)0x1c362e;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_b88 = (uv_loop_t *)0x1c3638;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_b78 = 0;
    puStack_b88 = (uv_loop_t *)0x1c3646;
    puVar2 = uv_default_loop();
    puStack_b88 = (uv_loop_t *)0x1c364e;
    iVar1 = uv_loop_close(puVar2);
    lStack_b70 = (long)iVar1;
    if (lStack_b78 == lStack_b70) {
      puStack_b88 = (uv_loop_t *)0x1c366a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_b88 = (uv_loop_t *)0x1c368a;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c368a:
    puStack_b88 = (uv_loop_t *)0x1c369c;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c369c:
    puStack_b88 = (uv_loop_t *)0x1c36ae;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c36ae:
    puStack_b88 = (uv_loop_t *)0x1c36c0;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c36c0:
    puStack_b88 = (uv_loop_t *)0x1c36d2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c36d2:
    puStack_b88 = (uv_loop_t *)0x1c36e4;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c36e4:
    puStack_b88 = (uv_loop_t *)0x1c36f3;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c36f3:
    puStack_b88 = (uv_loop_t *)0x1c3702;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c3702:
    puStack_b88 = (uv_loop_t *)0x1c3711;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c3711:
    puStack_b88 = (uv_loop_t *)0x1c3720;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  puStack_b88 = (uv_loop_t *)run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  uStack_c70._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_c70._4_4_ = 0;
  auStack_c80._8_8_ = (uv_loop_t *)0xf270002;
  puStack_b88 = (uv_loop_t *)unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&uStack_c60);
  auStack_c80._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_c80._0_8_ == (void *)0x0) {
    uv_close((uv_handle_t *)&uStack_c60,(uv_close_cb)0x0);
    iVar1 = uv_tcp_bind(&uStack_c60,(sockaddr *)(auStack_c80 + 8),0);
    auStack_c80._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_c80._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3876;
    iVar1 = uv_listen((uv_stream_t *)&uStack_c60,5,(uv_connection_cb)0x0);
    auStack_c80._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_c80._0_8_ != (void *)0xffffffffffffffea) goto LAB_001c3883;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_c80._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_c80._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_c80._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_c80._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c389d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c3876:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c3883:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c389d:
  handle = (uv_handle_t *)auStack_c80;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrinuse_listen) {
  struct sockaddr_in addr;
  uv_tcp_t server1, server2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}